

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O2

void output(code_int code,GifCtx *ctx)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  
  iVar2 = ctx->cur_bits;
  lVar3 = (long)iVar2;
  if (lVar3 == -1000) {
    return;
  }
  uVar6 = (long)code << ((byte)iVar2 & 0x3f) | ctx->cur_accum & masks[lVar3];
  if (iVar2 < 1) {
    uVar6 = (long)code;
  }
  ctx->cur_accum = uVar6;
  piVar1 = &ctx->n_bits;
  piVar5 = piVar1;
  while( true ) {
    iVar2 = (int)lVar3 + *piVar5;
    ctx->cur_bits = iVar2;
    if (iVar2 < 8) break;
    char_out((uint)uVar6 & 0xff,ctx);
    uVar6 = ctx->cur_accum >> 8;
    ctx->cur_accum = uVar6;
    lVar3 = 0xfffffff8;
    piVar5 = &ctx->cur_bits;
  }
  if (ctx->maxcode < ctx->free_ent) {
    if (ctx->clear_flg == 0) {
      iVar4 = *piVar1 + 1;
      *piVar1 = iVar4;
      if (iVar4 == 0xc) {
        ctx->maxcode = 0x1000;
      }
      else {
        ctx->maxcode = ~(-1 << ((byte)iVar4 & 0x1f));
      }
      goto LAB_00117957;
    }
  }
  else if (ctx->clear_flg == 0) goto LAB_00117957;
  ctx->n_bits = ctx->g_init_bits;
  ctx->maxcode = ~(-1 << ((byte)ctx->g_init_bits & 0x1f));
  ctx->clear_flg = 0;
LAB_00117957:
  if (ctx->EOFCode != code) {
    return;
  }
  while (0 < iVar2) {
    char_out((uint)uVar6 & 0xff,ctx);
    uVar6 = ctx->cur_accum >> 8;
    ctx->cur_accum = uVar6;
    iVar2 = ctx->cur_bits + -8;
    ctx->cur_bits = iVar2;
  }
  ctx->cur_bits = -1000;
  flush_char(ctx);
  return;
}

Assistant:

static void output(code_int code, GifCtx *ctx)
{
	if (ctx->cur_bits == CUR_BITS_FINISHED)
		return;
	ctx->cur_accum &= masks[ctx->cur_bits];

	if(ctx->cur_bits > 0) {
		ctx->cur_accum |= ((long)code << ctx->cur_bits);
	} else {
		ctx->cur_accum = code;
	}

	ctx->cur_bits += ctx->n_bits;

	while(ctx->cur_bits >= 8) {
		char_out((unsigned int)(ctx->cur_accum & 0xff), ctx);
		ctx->cur_accum >>= 8;
		ctx->cur_bits -= 8;
	}

	/*
	 * If the next entry is going to be too big for the code size,
	 * then increase it, if possible.
	 */
	if(ctx->free_ent > ctx->maxcode || ctx->clear_flg) {
		if(ctx->clear_flg) {
			ctx->maxcode = MAXCODE (ctx->n_bits = ctx->g_init_bits);
			ctx->clear_flg = 0;
		} else {
			++(ctx->n_bits);
			if(ctx->n_bits == maxbits) {
				ctx->maxcode = maxmaxcode;
			} else {
				ctx->maxcode = MAXCODE(ctx->n_bits);
			}
		}
	}

	if(code == ctx->EOFCode) {
		/* At EOF, write the rest of the buffer. */
		while(ctx->cur_bits > 0) {
			char_out((unsigned int)(ctx->cur_accum & 0xff), ctx);
			ctx->cur_accum >>= 8;
			ctx->cur_bits -= 8;
		}
		/* Flag that it's done to prevent re-entry. */
		ctx->cur_bits = CUR_BITS_FINISHED;

		flush_char(ctx);
	}
}